

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCec.c
# Opt level: O0

int Fra_FraigCec(Aig_Man_t **ppAig,int nConfLimit,int fVerbose)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  abctime aVar5;
  abctime aVar6;
  Aig_Man_t *pAVar7;
  abctime clk;
  int RetValue;
  int i;
  Aig_Man_t *pTemp;
  Aig_Man_t *pAig;
  Fra_Par_t *pParams;
  Fra_Par_t Params;
  int nBTLimitLast;
  int nBTLimitFirst;
  int nBTLimitStart;
  int fVerbose_local;
  int nConfLimit_local;
  Aig_Man_t **ppAig_local;
  
  pAVar7 = *ppAig;
  Params._116_4_ = nConfLimit;
  if (fVerbose != 0) {
    Aig_ManNodeNum(pAVar7);
    printf("Original miter:   Nodes = %6d.\n");
  }
  iVar1 = Fra_FraigMiterStatus(pAVar7);
  if (iVar1 == 0) {
    iVar1 = Aig_ManCiNum(pAVar7);
    pvVar4 = malloc((long)iVar1 << 2);
    pAVar7->pData = pvVar4;
    pvVar4 = pAVar7->pData;
    iVar1 = Aig_ManCiNum(pAVar7);
    memset(pvVar4,0,(long)iVar1 << 2);
    ppAig_local._4_4_ = 0;
  }
  else {
    aVar5 = Abc_Clock();
    clk._0_4_ = Fra_FraigSat(pAVar7,600,0,0,0,0,1,0,0,0);
    if (fVerbose != 0) {
      uVar2 = Aig_ManNodeNum(pAVar7);
      printf("Initial SAT:      Nodes = %6d.  ",(ulong)uVar2);
      Abc_Print(1,"%s =","Time");
      aVar6 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar5) * 1.0) / 1000000.0);
    }
    ppAig_local._4_4_ = (int)clk;
    if ((int)clk < 0) {
      aVar5 = Abc_Clock();
      pTemp = Dar_ManRwsat(pAVar7,1,0);
      Aig_ManStop(pAVar7);
      if (fVerbose != 0) {
        uVar2 = Aig_ManNodeNum(pTemp);
        printf("Rewriting:        Nodes = %6d.  ",(ulong)uVar2);
        Abc_Print(1,"%s =","Time");
        aVar6 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar5) * 1.0) / 1000000.0);
      }
      Fra_ParamsDefault((Fra_Par_t *)&pParams);
      Params.fDoSparse = 2;
      Params.fConeBias = 300;
      Params.fUse1Hot = 1;
      Params.fChoicing = 1;
      for (clk._4_4_ = 0; clk._4_4_ < 6; clk._4_4_ = clk._4_4_ + 1) {
        iVar1 = Aig_ManCountXors(pTemp);
        iVar3 = Aig_ManNodeNum(pTemp);
        if (iVar3 + 300 < iVar1 * 0x1e) {
          aVar5 = Abc_Clock();
          pAVar7 = Dar_ManBalanceXor(pTemp,1,0,0);
          Aig_ManStop(pTemp);
          pTemp = pAVar7;
          if (fVerbose != 0) {
            uVar2 = Aig_ManNodeNum(pAVar7);
            printf("Balance-X:        Nodes = %6d.  ",(ulong)uVar2);
            Abc_Print(1,"%s =","Time");
            aVar6 = Abc_Clock();
            Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar5) * 1.0) / 1000000.0);
          }
        }
        aVar5 = Abc_Clock();
        pAVar7 = Fra_FraigPerform(pTemp,(Fra_Par_t *)&pParams);
        Aig_ManStop(pTemp);
        if (fVerbose != 0) {
          uVar2 = Aig_ManNodeNum(pAVar7);
          printf("Fraiging (i=%d):   Nodes = %6d.  ",(ulong)(clk._4_4_ + 1),(ulong)uVar2);
          Abc_Print(1,"%s =","Time");
          aVar6 = Abc_Clock();
          Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar5) * 1.0) / 1000000.0);
        }
        clk._0_4_ = Fra_FraigMiterStatus(pAVar7);
        pTemp = pAVar7;
        if (-1 < (int)clk) break;
        aVar5 = Abc_Clock();
        pTemp = Dar_ManRewriteDefault(pAVar7);
        Aig_ManStop(pAVar7);
        if (fVerbose != 0) {
          uVar2 = Aig_ManNodeNum(pTemp);
          printf("Rewriting:        Nodes = %6d.  ",(ulong)uVar2);
          Abc_Print(1,"%s =","Time");
          aVar6 = Abc_Clock();
          Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar5) * 1.0) / 1000000.0);
        }
        clk._0_4_ = Fra_FraigMiterStatus(pTemp);
        if (-1 < (int)clk) break;
        Params.fDoSparse = Params.fDoSparse << 3;
        Params.fConeBias = Params.fConeBias << 1;
      }
      if ((int)clk == -1) {
        aVar5 = Abc_Clock();
        clk._0_4_ = Fra_FraigSat(pTemp,(long)(int)Params._116_4_,0,0,0,0,1,0,0,0);
        if (fVerbose != 0) {
          uVar2 = Aig_ManNodeNum(pTemp);
          printf("Final SAT:        Nodes = %6d.  ",(ulong)uVar2);
          Abc_Print(1,"%s =","Time");
          aVar6 = Abc_Clock();
          Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar5) * 1.0) / 1000000.0);
        }
      }
      *ppAig = pTemp;
      ppAig_local._4_4_ = (int)clk;
    }
  }
  return ppAig_local._4_4_;
}

Assistant:

int Fra_FraigCec( Aig_Man_t ** ppAig, int nConfLimit, int fVerbose )
{
    int nBTLimitStart =        300;   // starting SAT run
    int nBTLimitFirst =          2;   // first fraiging iteration
    int nBTLimitLast  = nConfLimit;   // the last-gasp SAT run

    Fra_Par_t Params, * pParams = &Params;
    Aig_Man_t * pAig = *ppAig, * pTemp;
    int i, RetValue;
    abctime clk;

    // report the original miter
    if ( fVerbose )
    {
        printf( "Original miter:   Nodes = %6d.\n", Aig_ManNodeNum(pAig) );
    }
    RetValue = Fra_FraigMiterStatus( pAig );
//    assert( RetValue == -1 );
    if ( RetValue == 0 )
    {
        pAig->pData = ABC_ALLOC( int, Aig_ManCiNum(pAig) );
        memset( pAig->pData, 0, sizeof(int) * Aig_ManCiNum(pAig) );
        return RetValue;
    }

    // if SAT only, solve without iteration
clk = Abc_Clock();
    RetValue = Fra_FraigSat( pAig, (ABC_INT64_T)2*nBTLimitStart, (ABC_INT64_T)0, 0, 0, 0, 1, 0, 0, 0 );
    if ( fVerbose )
    {
        printf( "Initial SAT:      Nodes = %6d.  ", Aig_ManNodeNum(pAig) );
ABC_PRT( "Time", Abc_Clock() - clk );
    }
    if ( RetValue >= 0 )
        return RetValue;

    // duplicate the AIG
clk = Abc_Clock();
    pAig = Dar_ManRwsat( pTemp = pAig, 1, 0 );
    Aig_ManStop( pTemp );
    if ( fVerbose )
    {
        printf( "Rewriting:        Nodes = %6d.  ", Aig_ManNodeNum(pAig) );
ABC_PRT( "Time", Abc_Clock() - clk );
    }

    // perform the loop
    Fra_ParamsDefault( pParams );
    pParams->nBTLimitNode = nBTLimitFirst;
    pParams->nBTLimitMiter = nBTLimitStart;
    pParams->fDontShowBar = 1;
    pParams->fProve = 1;
    for ( i = 0; i < 6; i++ )
    {
//printf( "Running fraiging with %d BTnode and %d BTmiter.\n", pParams->nBTLimitNode, pParams->nBTLimitMiter );
        // try XOR balancing
        if ( Aig_ManCountXors(pAig) * 30 > Aig_ManNodeNum(pAig) + 300 )
        {
clk = Abc_Clock();
            pAig = Dar_ManBalanceXor( pTemp = pAig, 1, 0, 0 );
            Aig_ManStop( pTemp );
            if ( fVerbose )
            {
                printf( "Balance-X:        Nodes = %6d.  ", Aig_ManNodeNum(pAig) );
ABC_PRT( "Time", Abc_Clock() - clk );
            } 
        }

        // run fraiging
clk = Abc_Clock();
        pAig = Fra_FraigPerform( pTemp = pAig, pParams );
        Aig_ManStop( pTemp );
        if ( fVerbose )
        {
            printf( "Fraiging (i=%d):   Nodes = %6d.  ", i+1, Aig_ManNodeNum(pAig) );
ABC_PRT( "Time", Abc_Clock() - clk );
        }

        // check the miter status
        RetValue = Fra_FraigMiterStatus( pAig );
        if ( RetValue >= 0 )
            break;

        // perform rewriting
clk = Abc_Clock();
        pAig = Dar_ManRewriteDefault( pTemp = pAig );
        Aig_ManStop( pTemp );
        if ( fVerbose )
        {
            printf( "Rewriting:        Nodes = %6d.  ", Aig_ManNodeNum(pAig) );
ABC_PRT( "Time", Abc_Clock() - clk );
        } 

        // check the miter status
        RetValue = Fra_FraigMiterStatus( pAig );
        if ( RetValue >= 0 )
            break;
        // try simulation

        // set the parameters for the next run
        pParams->nBTLimitNode = 8 * pParams->nBTLimitNode;
        pParams->nBTLimitMiter = 2 * pParams->nBTLimitMiter;
    }

    // if still unsolved try last gasp
    if ( RetValue == -1 )
    {
clk = Abc_Clock();
        RetValue = Fra_FraigSat( pAig, (ABC_INT64_T)nBTLimitLast, (ABC_INT64_T)0, 0, 0, 0, 1, 0, 0, 0 );
        if ( fVerbose )
        {
            printf( "Final SAT:        Nodes = %6d.  ", Aig_ManNodeNum(pAig) );
ABC_PRT( "Time", Abc_Clock() - clk );
        }
    }

    *ppAig = pAig;
    return RetValue;
}